

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O0

ostream * operator<<(ostream *out,RangeValue *shape)

{
  RangeValue *this;
  bool bVar1;
  size_t sVar2;
  allocator local_39;
  string local_38 [32];
  RangeValue *local_18;
  RangeValue *shape_local;
  ostream *out_local;
  
  local_18 = shape;
  shape_local = (RangeValue *)out;
  bVar1 = CoreML::RangeValue::isUnbound(shape);
  this = shape_local;
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_38,"inf",&local_39);
    std::operator<<((ostream *)this,local_38);
    std::__cxx11::string::~string(local_38);
    std::allocator<char>::~allocator((allocator<char> *)&local_39);
  }
  else {
    sVar2 = CoreML::RangeValue::value(local_18);
    std::ostream::operator<<(this,sVar2);
  }
  return (ostream *)shape_local;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const RangeValue& shape) {
    if (shape.isUnbound()) {
        out << std::string("inf");
    }
    else {
        out << shape.value();
    }
    return out;
}